

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

void __thiscall
llm_graph_input_attn_temp::set_input(llm_graph_input_attn_temp *this,llama_ubatch *ubatch)

{
  ggml_tensor *pgVar1;
  long lVar2;
  pointer pfVar3;
  long lVar4;
  ulong __n;
  ulong uVar5;
  float fVar6;
  double dVar7;
  vector<float,_std::allocator<float>_> attn_scale_data;
  allocator_type local_41;
  vector<float,_std::allocator<float>_> local_40;
  value_type_conflict5 local_24;
  
  if ((ubatch->pos != (llama_pos *)0x0) && (this->attn_scale != (ggml_tensor *)0x0)) {
    __n = (ulong)ubatch->n_tokens;
    local_24 = 0.0;
    std::vector<float,_std::allocator<float>_>::vector(&local_40,__n,&local_24,&local_41);
    if (__n != 0) {
      uVar5 = 0;
      do {
        fVar6 = floorf(((float)ubatch->pos[uVar5] + 1.0) / (float)this->n_attn_temp_floor_scale);
        dVar7 = log((double)fVar6 + 1.0);
        local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] = (float)((double)this->f_attn_temp_scale * dVar7 + 1.0);
        uVar5 = uVar5 + 1;
      } while (__n != uVar5);
    }
    pfVar3 = local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pgVar1 = this->attn_scale;
    lVar2 = this->n_pos_per_token;
    lVar4 = ggml_element_size(pgVar1);
    ggml_backend_tensor_set(pgVar1,pfVar3,0,lVar2 * __n * lVar4);
    if (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void llm_graph_input_attn_temp::set_input(const llama_ubatch * ubatch) {
    if (ubatch->pos && attn_scale) {
        const int64_t n_tokens = ubatch->n_tokens;

        std::vector<float> attn_scale_data(n_tokens, 0.0f);
        for (int i = 0; i < n_tokens; ++i) {
            const float pos = ubatch->pos[i];
            attn_scale_data[i] = std::log(
                std::floor((pos + 1.0f) / n_attn_temp_floor_scale) + 1.0
            ) * f_attn_temp_scale + 1.0;
        }

        ggml_backend_tensor_set(attn_scale, attn_scale_data.data(), 0, n_tokens*n_pos_per_token*ggml_element_size(attn_scale));
    }
}